

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast_pybind_kukakr5arc.cpp
# Opt level: O0

void pybind11_init_ikfast_kukakr5arc(module *m)

{
  object_api<pybind11::handle> *poVar1;
  str_attr_accessor local_a0;
  type local_7a;
  type local_79;
  arg local_78;
  type local_61;
  arg local_60;
  arg local_50;
  type local_3d [13];
  str_attr_accessor local_30;
  object_api<pybind11::handle> *local_10;
  module *m_local;
  
  local_10 = (object_api<pybind11::handle> *)m;
  pybind11::detail::object_api<pybind11::handle>::doc(&local_30,(object_api<pybind11::handle> *)m);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_30,
             (char (*) [215])
             "\n        ikfast_pybind_kukakr5arc\n        -----------------------\n        .. currentmodule:: ikfast_pybind_kukakr5arc\n        .. autosummary::\n           :toctree: _generate\n           get_ik\n           get_fk\n    "
            );
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_30);
  poVar1 = local_10;
  pybind11::arg::arg(&local_50,"trans_list");
  pybind11::arg::arg(&local_60,"rot_list");
  pybind11::module::
  def<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::__0,pybind11::arg,pybind11::arg,char[68]>
            ((module *)poVar1,"get_ik",local_3d,&local_50,&local_60,
             (char (*) [68])"\n        get inverse kinematic solutions for pybind_kukakr5arc\n    ")
  ;
  poVar1 = local_10;
  pybind11::arg::arg(&local_78,"joint_list");
  pybind11::module::
  def<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::__1,pybind11::arg,char[64]>
            ((module *)poVar1,"get_fk",&local_61,&local_78,
             (char (*) [64])"\n        get forward kinematic solutions for kuka_kr6_r900\n    ");
  pybind11::module::def<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::__2,char[63]>
            ((module *)local_10,"get_dof",&local_79,
             (char (*) [63])"\n        get number dofs configured for the ikfast module\n    ");
  pybind11::module::def<pybind11_init_ikfast_kukakr5arc(pybind11::module&)::__3,char[71]>
            ((module *)local_10,"get_free_dof",&local_7a,
             (char (*) [71])
             "\n        get number of free dofs configured for the ikfast module\n    ");
  pybind11::detail::object_api<pybind11::handle>::attr(&local_a0,local_10,"__version__");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_a0,(char (*) [4])"dev");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_a0);
  return;
}

Assistant:

PYBIND11_MODULE(ikfast_kukakr5arc, m)
{
    m.doc() = R"pbdoc(
        ikfast_pybind_kukakr5arc
        -----------------------
        .. currentmodule:: ikfast_pybind_kukakr5arc
        .. autosummary::
           :toctree: _generate
           get_ik
           get_fk
    )pbdoc";

    m.def("get_ik", [](const std::vector<double> &trans_list,
                       const std::vector<std::vector<double>> &rot_list)
    {
      using namespace ikfast;
      IkSolutionList<double> solutions;

      std::vector<double> vfree(GetNumFreeParameters());
      double eerot[9], eetrans[3];

      for(std::size_t i = 0; i < 3; ++i)
      {
          eetrans[i] = trans_list[i];
          std::vector<double> rot_vec = rot_list[i];
          for(std::size_t j = 0; j < 3; ++j)
          {
              eerot[3*i + j] = rot_vec[j];
          }
      }

      // call ikfast routine
      bool b_success = ComputeIk(eetrans, eerot, &vfree[0], solutions);

      std::vector<std::vector<double>> solution_list;
      if (!b_success)
      {
          //fprintf(stderr,"Failed to get ik solution\n");
          return solution_list; // Equivalent to returning None in python
      }

      std::vector<double> solvalues(GetNumJoints());

      // convert all ikfast solutions into a std::vector
      for(std::size_t i = 0; i < solutions.GetNumSolutions(); ++i)
      {
          const IkSolutionBase<double>& sol = solutions.GetSolution(i);
          std::vector<double> vsolfree(sol.GetFree().size());
          sol.GetSolution(&solvalues[0],
                          vsolfree.size() > 0 ? &vsolfree[0] : NULL);

          std::vector<double> individual_solution = std::vector<double>(GetNumJoints());
          for(std::size_t j = 0; j < solvalues.size(); ++j)
          {
              individual_solution[j] = solvalues[j];
          }
          solution_list.push_back(individual_solution);
      }
      return solution_list;
    },
    py::arg("trans_list"),
    py::arg("rot_list"),
    R"pbdoc(
        get inverse kinematic solutions for pybind_kukakr5arc
    )pbdoc");

    m.def("get_fk", [](const std::vector<double> &joint_list)
    {
      using namespace ikfast;
      // eerot is a flattened 3x3 rotation matrix
      double eerot[9], eetrans[3];

      std::vector<double> joints(GetNumJoints());
      for(std::size_t i = 0; i < GetNumJoints(); ++i)
      {
          joints[i] = joint_list[i];
      }

      // call ikfast routine
      ComputeFk(&joints[0], eetrans, eerot);

      // convert computed EE pose to a python object
      std::vector<double> pos(3);
      std::vector<std::vector<double>> rot(3);

      for(std::size_t i = 0; i < 3; ++i)
      {
          pos[i] = eetrans[i];
          std::vector<double> rot_vec(3);
          for( std::size_t j = 0; j < 3; ++j)
          {
              rot_vec[j] = eerot[3*i + j];
          }
          rot[i] = rot_vec;
      }
      return std::make_tuple(pos, rot);
    },
    py::arg("joint_list"),
    R"pbdoc(
        get forward kinematic solutions for kuka_kr6_r900
    )pbdoc");

    m.def("get_dof", []()
    {
      return int(GetNumJoints());
    },
    R"pbdoc(
        get number dofs configured for the ikfast module
    )pbdoc");

    m.def("get_free_dof", []()
    {
      return int(GetNumFreeParameters());
    },
    R"pbdoc(
        get number of free dofs configured for the ikfast module
    )pbdoc");

#ifdef VERSION_INFO
    m.attr("__version__") = VERSION_INFO;
#else
    m.attr("__version__") = "dev";
#endif

}